

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int __status;
  char cVar1;
  Statements *this;
  ostream *poVar2;
  Parser parser;
  SymTab symTab;
  Token lastToken;
  Tokenizer tokenizer;
  ifstream inputStream;
  
  if (argc == 2) {
    std::ifstream::ifstream(&inputStream);
    std::ifstream::open((char *)&inputStream,(_Ios_Openmode)argv[1]);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      poVar2 = std::operator<<((ostream *)&std::cout,"Unable top open ");
      poVar2 = std::operator<<(poVar2,argv[1]);
      std::operator<<(poVar2,". Terminating...");
      perror("Error when attempting to open the input file.");
      __status = 2;
      goto LAB_001037e8;
    }
    Tokenizer::Tokenizer(&tokenizer,&inputStream);
    parser.tokenizer = &tokenizer;
    this = Parser::fileInput(&parser);
    Tokenizer::getToken(&lastToken,&tokenizer);
    if (lastToken._eof != false) {
      symTab.symTab._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &symTab.symTab._M_t._M_impl.super__Rb_tree_header._M_header;
      symTab.symTab._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      symTab.symTab._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      symTab.symTab._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      symTab.symTab._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           symTab.symTab._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::operator<<((ostream *)&std::cout,"INPUT\n");
      std::operator<<((ostream *)&std::cout,"********\n");
      Statements::print(this);
      std::operator<<((ostream *)&std::cout,"OUTPUT\n");
      std::operator<<((ostream *)&std::cout,"********\n");
      Statements::evaluate(this,&symTab);
      poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::operator<<(poVar2,"Symbol table contains the following variables.\n");
      SymTab::print(&symTab);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>_>
                   *)&symTab);
      Token::~Token(&lastToken);
      Tokenizer::~Tokenizer(&tokenizer);
      std::ifstream::~ifstream(&inputStream);
      return 0;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Unexpected token in input.");
    std::endl<char,std::char_traits<char>>(poVar2);
    Token::print(&lastToken);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    std::operator<<(poVar2," nameOfAnInputFile\n");
  }
  __status = 1;
LAB_001037e8:
  exit(__status);
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc != 2) {
        std::cout << "usage: " << argv[0] << " nameOfAnInputFile\n";
        exit(1);
    }
    std::ifstream inputStream;
    inputStream.open(argv[1], std::ios::in);
    if (!inputStream.is_open()) {
        std::cout << "Unable top open " << argv[1] << ". Terminating...";
        perror("Error when attempting to open the input file.");
        exit(2);
    }
    // Create tokens from Python file 
    Tokenizer tokenizer(inputStream); 

    // Parse tokens converting into matched Python statements
    Parser parser(tokenizer); 
    Statements *statements = parser.fileInput();

    Token lastToken = tokenizer.getToken();
    if (!lastToken.eof()) {
        std::cout << "Unexpected token in input." << std::endl;
        lastToken.print();
        exit(1);
    }
    // Use Symbol table to map variables and data types
    SymTab symTab;
    std::cout << "INPUT\n";
    std::cout << "********\n";
    statements->print();

    std::cout << "OUTPUT\n";
    std::cout << "********\n";

    // Evaluate and calculate Python statements and expressions
    statements->evaluate(symTab);
    std::cout << std::endl << "Symbol table contains the following variables.\n";
    symTab.print();

    return 0;
}